

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

QPointF __thiscall QScroller::pixelPerMeter(QScroller *this)

{
  QPointF QVar1;
  bool bVar2;
  QScrollerPrivate *pQVar3;
  QGraphicsObject *pQVar4;
  QGraphicsScene *pQVar5;
  qreal *pqVar6;
  long in_FS_OFFSET;
  double dVar7;
  qreal qVar8;
  qreal qVar9;
  QGraphicsScene *scene;
  QGraphicsObject *go;
  QScrollerPrivate *d;
  QPointF py;
  QPointF px;
  QPointF p0;
  QList<QGraphicsView_*> views;
  QPointF ppm;
  QTransform tr;
  QTransform viewtr;
  QTransform *in_stack_fffffffffffffe00;
  QGraphicsScene *in_stack_fffffffffffffe08;
  QGraphicsView *in_stack_fffffffffffffe18;
  QTransform *in_stack_fffffffffffffe48;
  QGraphicsItem *in_stack_fffffffffffffe50;
  QLineF local_1a0;
  QPointF local_180;
  QPointF local_170;
  QPointF local_160;
  QPointF local_150;
  QPointF local_140;
  QPointF local_130;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  QPointF local_108;
  undefined1 local_f8 [80];
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QScroller *)0xa81b0b);
  local_108.xp = (pQVar3->pixelPerMeter).xp;
  local_108.yp = (pQVar3->pixelPerMeter).yp;
  pQVar4 = qobject_cast<QGraphicsObject*>((QObject *)0xa81b5f);
  if (pQVar4 != (QGraphicsObject *)0x0) {
    memcpy(local_58,&DAT_00b4bdb0,0x50);
    QTransform::QTransform(in_stack_fffffffffffffe00);
    pQVar5 = QGraphicsItem::scene((QGraphicsItem *)0xa81ba4);
    if (pQVar5 != (QGraphicsScene *)0x0) {
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_110 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsScene::views(in_stack_fffffffffffffe08);
      bVar2 = QList<QGraphicsView_*>::isEmpty((QList<QGraphicsView_*> *)0xa81c01);
      if (!bVar2) {
        QList<QGraphicsView_*>::first((QList<QGraphicsView_*> *)in_stack_fffffffffffffe00);
        QGraphicsView::viewportTransform(in_stack_fffffffffffffe18);
        memcpy(local_58,local_a8,0x4a);
      }
      QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0xa81c49);
    }
    memcpy(local_f8,&DAT_00b4be18,0x50);
    QGraphicsItem::deviceTransform(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    bVar2 = QTransform::isScaling((QTransform *)0xa81c8d);
    if (bVar2) {
      local_130.xp = -NAN;
      local_130.yp = -NAN;
      qVar9 = 0.0;
      QPointF::QPointF(&local_140,0.0,0.0);
      local_130.xp = (qreal)QTransform::map((QPointF *)local_f8);
      local_150.xp = -NAN;
      local_150.yp = -NAN;
      qVar8 = 0.0;
      local_130.yp = qVar9;
      QPointF::QPointF(&local_160,1.0,0.0);
      local_150.xp = (qreal)QTransform::map((QPointF *)local_f8);
      local_170.xp = -NAN;
      local_170.yp = -NAN;
      qVar9 = 1.0;
      local_150.yp = qVar8;
      QPointF::QPointF(&local_180,0.0,1.0);
      local_170.xp = (qreal)QTransform::map((QPointF *)local_f8);
      local_170.yp = qVar9;
      QLineF::QLineF(&local_1a0,&local_130,&local_150);
      dVar7 = (double)QLineF::length();
      pqVar6 = QPointF::rx(&local_108);
      *pqVar6 = *pqVar6 / dVar7;
      QLineF::QLineF((QLineF *)&stack0xfffffffffffffe40,&local_130,&local_170);
      dVar7 = (double)QLineF::length();
      pqVar6 = QPointF::ry(&local_108);
      *pqVar6 = *pqVar6 / dVar7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.yp = local_108.yp;
  QVar1.xp = local_108.xp;
  return QVar1;
}

Assistant:

QPointF QScroller::pixelPerMeter() const
{
    Q_D(const QScroller);
    QPointF ppm = d->pixelPerMeter;

#if QT_CONFIG(graphicsview)
    if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->target)) {
        QTransform viewtr;
        //TODO: the first view isn't really correct - maybe use an additional field in the prepare event?
        if (const auto *scene = go->scene()) {
            const auto views = scene->views();
            if (!views.isEmpty())
                viewtr = views.first()->viewportTransform();
        }
        QTransform tr = go->deviceTransform(viewtr);
        if (tr.isScaling()) {
            QPointF p0 = tr.map(QPointF(0, 0));
            QPointF px = tr.map(QPointF(1, 0));
            QPointF py = tr.map(QPointF(0, 1));
            ppm.rx() /= QLineF(p0, px).length();
            ppm.ry() /= QLineF(p0, py).length();
        }
    }
#endif // QT_CONFIG(graphicsview)
    return ppm;
}